

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O3

void __thiscall zmq::session_base_t::reconnect(session_base_t *this)

{
  pipe_t *this_00;
  int iVar1;
  uint uVar2;
  string *addr_;
  
  if ((this->_pipe != (pipe_t *)0x0) && ((this->super_own_t).options.immediate == 1)) {
    iVar1 = std::__cxx11::string::compare((char *)this->_addr);
    if (iVar1 != 0) {
      pipe_t::hiccup(this->_pipe);
      pipe_t::terminate(this->_pipe,false);
      std::
      _Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
      ::_M_insert_unique<zmq::pipe_t*const&>
                ((_Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
                  *)&this->_terminating_pipes,&this->_pipe);
      this->_pipe = (pipe_t *)0x0;
      if (this->_has_linger_timer == true) {
        io_object_t::cancel_timer(&this->super_io_object_t,0x20);
        this->_has_linger_timer = false;
      }
    }
  }
  (*(this->super_own_t).super_object_t._vptr_object_t[0x18])(this);
  if ((this->super_own_t).options.reconnect_ivl < 1) {
    addr_ = (string *)operator_new(0x20);
    (addr_->_M_dataplus)._M_p = (pointer)&addr_->field_2;
    addr_->_M_string_length = 0;
    (addr_->field_2)._M_local_buf[0] = '\0';
    address_t::to_string(this->_addr,addr_);
    object_t::send_term_endpoint((object_t *)this,&this->_socket->super_own_t,addr_);
  }
  else {
    start_connecting(this,true);
  }
  this_00 = this->_pipe;
  if (((this_00 != (pipe_t *)0x0) &&
      (uVar2 = (uint)(byte)(this->super_own_t).options.type, uVar2 < 0x10)) &&
     ((0x8404U >> (uVar2 & 0x1f) & 1) != 0)) {
    pipe_t::hiccup(this_00);
    return;
  }
  return;
}

Assistant:

void zmq::session_base_t::reconnect ()
{
    //  For delayed connect situations, terminate the pipe
    //  and reestablish later on
    if (_pipe && options.immediate == 1
#ifdef ZMQ_HAVE_OPENPGM
        && _addr->protocol != protocol_name::pgm
        && _addr->protocol != protocol_name::epgm
#endif
#ifdef ZMQ_HAVE_NORM
        && _addr->protocol != protocol_name::norm
#endif
        && _addr->protocol != protocol_name::udp) {
        _pipe->hiccup ();
        _pipe->terminate (false);
        _terminating_pipes.insert (_pipe);
        _pipe = NULL;

        if (_has_linger_timer) {
            cancel_timer (linger_timer_id);
            _has_linger_timer = false;
        }
    }

    reset ();

    //  Reconnect.
    if (options.reconnect_ivl > 0)
        start_connecting (true);
    else {
        std::string *ep = new (std::string);
        _addr->to_string (*ep);
        send_term_endpoint (_socket, ep);
    }

    //  For subscriber sockets we hiccup the inbound pipe, which will cause
    //  the socket object to resend all the subscriptions.
    if (_pipe
        && (options.type == ZMQ_SUB || options.type == ZMQ_XSUB
            || options.type == ZMQ_DISH))
        _pipe->hiccup ();
}